

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::CalculatePosition
          (SscReaderGeneric *this,BlockVecVec *bvv,RankPosMap *allRanks)

{
  pointer pvVar1;
  pointer pBVar2;
  BlockInfo *b;
  mapped_type *pmVar3;
  long lVar4;
  pointer pBVar5;
  size_t sVar6;
  __node_base *p_Var7;
  unsigned_long uVar8;
  int local_3c;
  _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_3c = 0;
  uVar8 = 0;
  local_38 = (_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)allRanks;
  do {
    p_Var7 = &(allRanks->_M_h)._M_before_begin;
    if ((int)(((long)(bvv->
                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(bvv->
                    super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= local_3c) {
      return;
    }
    do {
      p_Var7 = p_Var7->_M_nxt;
      if (p_Var7 == (__node_base *)0x0) goto LAB_0014f166;
    } while ((int)*(size_type *)(p_Var7 + 1) != local_3c);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_38,&local_3c);
    pmVar3->first = uVar8;
    lVar4 = (long)local_3c;
    pvVar1 = (bvv->
             super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = *(pointer *)
              ((long)&pvVar1[lVar4].
                      super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (pBVar5 = pvVar1[lVar4].
                  super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar5 != pBVar2; pBVar5 = pBVar5 + 1)
    {
      pBVar5->bufferStart = pBVar5->bufferStart + uVar8;
    }
    sVar6 = TotalDataSize(pvVar1 + lVar4);
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_38,&local_3c);
    pmVar3->second = sVar6 + 1;
    uVar8 = uVar8 + sVar6 + 1;
LAB_0014f166:
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void SscReaderGeneric::CalculatePosition(ssc::BlockVecVec &bvv, ssc::RankPosMap &allRanks)
{

    size_t bufferPosition = 0;

    for (int rank = 0; rank < static_cast<int>(bvv.size()); ++rank)
    {
        bool hasOverlap = false;
        for (const auto &r : allRanks)
        {
            if (r.first == rank)
            {
                hasOverlap = true;
                break;
            }
        }
        if (hasOverlap)
        {
            allRanks[rank].first = bufferPosition;
            auto &bv = bvv[rank];
            for (auto &b : bv)
            {
                b.bufferStart += bufferPosition;
            }
            size_t currentRankTotalSize = ssc::TotalDataSize(bv);
            allRanks[rank].second = currentRankTotalSize + 1;
            bufferPosition += currentRankTotalSize + 1;
        }
    }
}